

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprVectorRegister(Parse *pParse,Expr *pVector,int iField,int regSelect,Expr **ppExpr,
                      int *pRegFree)

{
  undefined8 uVar1;
  Expr *pEVar2;
  int in_ECX;
  int in_EDX;
  char *in_RSI;
  Expr *in_R8;
  int *in_R9;
  u8 op;
  undefined7 in_stack_ffffffffffffffc8;
  int local_4;
  
  if (*in_RSI == -0x5c) {
    pEVar2 = sqlite3VectorFieldSubexpr((Expr *)CONCAT17(0xa4,in_stack_ffffffffffffffc8),0);
    *(Expr **)in_R8 = pEVar2;
    local_4 = *(int *)(in_RSI + 0x2c) + in_EDX;
  }
  else if (*in_RSI == '\x7f') {
    uVar1 = *(undefined8 *)(**(long **)(in_RSI + 0x20) + 8 + (long)in_EDX * 0x20);
    in_R8->op = (char)uVar1;
    in_R8->affinity = (char)((ulong)uVar1 >> 8);
    *(short *)&in_R8->field_0x2 = (short)((ulong)uVar1 >> 0x10);
    in_R8->flags = (int)((ulong)uVar1 >> 0x20);
    local_4 = in_ECX + in_EDX;
  }
  else {
    uVar1 = *(undefined8 *)(*(long *)(in_RSI + 0x20) + 8 + (long)in_EDX * 0x20);
    in_R8->op = (char)uVar1;
    in_R8->affinity = (char)((ulong)uVar1 >> 8);
    *(short *)&in_R8->field_0x2 = (short)((ulong)uVar1 >> 0x10);
    in_R8->flags = (int)((ulong)uVar1 >> 0x20);
    local_4 = sqlite3ExprCodeTemp((Parse *)CONCAT44(in_EDX,in_ECX),in_R8,in_R9);
  }
  return local_4;
}

Assistant:

static int exprVectorRegister(
  Parse *pParse,                  /* Parse context */
  Expr *pVector,                  /* Vector to extract element from */
  int iField,                     /* Field to extract from pVector */
  int regSelect,                  /* First in array of registers */
  Expr **ppExpr,                  /* OUT: Expression element */
  int *pRegFree                   /* OUT: Temp register to free */
){
  u8 op = pVector->op;
  assert( op==TK_VECTOR || op==TK_REGISTER || op==TK_SELECT );
  if( op==TK_REGISTER ){
    *ppExpr = sqlite3VectorFieldSubexpr(pVector, iField);
    return pVector->iTable+iField;
  }
  if( op==TK_SELECT ){
    *ppExpr = pVector->x.pSelect->pEList->a[iField].pExpr;
     return regSelect+iField;
  }
  *ppExpr = pVector->x.pList->a[iField].pExpr;
  return sqlite3ExprCodeTemp(pParse, *ppExpr, pRegFree);
}